

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O0

int BlendPlane(uint8_t *src_y0,int src_stride_y0,uint8_t *src_y1,int src_stride_y1,uint8_t *alpha,
              int alpha_stride,uint8_t *dst_y,int dst_stride_y,int width,int height)

{
  int iVar1;
  uint in_ECX;
  long in_RDX;
  uint in_ESI;
  long in_RDI;
  long in_R8;
  uint in_R9D;
  _func_void_uint8_t_ptr_uint8_t_ptr_uint8_t_ptr_uint8_t_ptr_int *BlendPlaneRow;
  int y;
  int in_stack_00000020;
  code *pcVar2;
  int local_38;
  uint local_34;
  long local_30;
  uint local_24;
  long local_20;
  uint local_14;
  long local_10;
  int local_4;
  
  pcVar2 = BlendPlaneRow_C;
  if (((((in_RDI == 0) || (in_RDX == 0)) || (in_R8 == 0)) ||
      ((BlendPlaneRow == (_func_void_uint8_t_ptr_uint8_t_ptr_uint8_t_ptr_uint8_t_ptr_int *)0x0 ||
       ((int)(uint)alpha < 1)))) || (in_stack_00000020 == 0)) {
    local_4 = -1;
  }
  else {
    if (in_stack_00000020 < 0) {
      in_stack_00000020 = -in_stack_00000020;
      BlendPlaneRow = BlendPlaneRow + (in_stack_00000020 + -1) * y;
      y = -y;
    }
    local_34 = in_R9D;
    local_24 = in_ECX;
    local_14 = in_ESI;
    if (((in_ESI == (uint)alpha) && (in_ECX == (uint)alpha)) &&
       ((in_R9D == (uint)alpha && (y == (uint)alpha)))) {
      alpha._0_4_ = in_stack_00000020 * (uint)alpha;
      in_stack_00000020 = 1;
      y = 0;
      local_34 = 0;
      local_24 = 0;
      local_14 = 0;
    }
    iVar1 = libyuv::TestCpuFlag(0);
    if ((iVar1 != 0) && (pcVar2 = BlendPlaneRow_Any_SSSE3, ((uint)alpha & 7) == 0)) {
      pcVar2 = BlendPlaneRow_SSSE3;
    }
    iVar1 = libyuv::TestCpuFlag(0);
    if ((iVar1 != 0) && (pcVar2 = BlendPlaneRow_Any_AVX2, ((uint)alpha & 0x1f) == 0)) {
      pcVar2 = BlendPlaneRow_AVX2;
    }
    local_30 = in_R8;
    local_20 = in_RDX;
    local_10 = in_RDI;
    for (local_38 = 0; local_38 < in_stack_00000020; local_38 = local_38 + 1) {
      (*pcVar2)(local_10,local_20,local_30,BlendPlaneRow,(uint)alpha);
      local_10 = local_10 + (int)local_14;
      local_20 = local_20 + (int)local_24;
      local_30 = local_30 + (int)local_34;
      BlendPlaneRow = BlendPlaneRow + y;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

LIBYUV_API
int BlendPlane(const uint8_t* src_y0,
               int src_stride_y0,
               const uint8_t* src_y1,
               int src_stride_y1,
               const uint8_t* alpha,
               int alpha_stride,
               uint8_t* dst_y,
               int dst_stride_y,
               int width,
               int height) {
  int y;
  void (*BlendPlaneRow)(const uint8_t* src0, const uint8_t* src1,
                        const uint8_t* alpha, uint8_t* dst, int width) =
      BlendPlaneRow_C;
  if (!src_y0 || !src_y1 || !alpha || !dst_y || width <= 0 || height == 0) {
    return -1;
  }
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    dst_y = dst_y + (height - 1) * dst_stride_y;
    dst_stride_y = -dst_stride_y;
  }

  // Coalesce rows for Y plane.
  if (src_stride_y0 == width && src_stride_y1 == width &&
      alpha_stride == width && dst_stride_y == width) {
    width *= height;
    height = 1;
    src_stride_y0 = src_stride_y1 = alpha_stride = dst_stride_y = 0;
  }

#if defined(HAS_BLENDPLANEROW_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3)) {
    BlendPlaneRow = BlendPlaneRow_Any_SSSE3;
    if (IS_ALIGNED(width, 8)) {
      BlendPlaneRow = BlendPlaneRow_SSSE3;
    }
  }
#endif
#if defined(HAS_BLENDPLANEROW_AVX2)
  if (TestCpuFlag(kCpuHasAVX2)) {
    BlendPlaneRow = BlendPlaneRow_Any_AVX2;
    if (IS_ALIGNED(width, 32)) {
      BlendPlaneRow = BlendPlaneRow_AVX2;
    }
  }
#endif
#if defined(HAS_BLENDPLANEROW_MMI)
  if (TestCpuFlag(kCpuHasMMI)) {
    BlendPlaneRow = BlendPlaneRow_Any_MMI;
    if (IS_ALIGNED(width, 8)) {
      BlendPlaneRow = BlendPlaneRow_MMI;
    }
  }
#endif

  for (y = 0; y < height; ++y) {
    BlendPlaneRow(src_y0, src_y1, alpha, dst_y, width);
    src_y0 += src_stride_y0;
    src_y1 += src_stride_y1;
    alpha += alpha_stride;
    dst_y += dst_stride_y;
  }
  return 0;
}